

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FState * __thiscall FStateDefinitions::FindState(FStateDefinitions *this,char *name)

{
  undefined8 in_RAX;
  FStateDefine *pFVar1;
  FState *pFVar2;
  uint i;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  MakeStateNameList(name);
  uVar3 = 0;
  pFVar1 = (FStateDefine *)0x0;
  while( true ) {
    if (MakeStateNameList::namelist.Count <= uVar3) {
      if (pFVar1 == (FStateDefine *)0x0) {
        pFVar2 = (FState *)0x0;
      }
      else {
        pFVar2 = pFVar1->State;
      }
      return pFVar2;
    }
    uStack_28 = CONCAT44(MakeStateNameList::namelist.Array[uVar3].Index,(undefined4)uStack_28);
    pFVar1 = FindStateLabelInList(&this->StateLabels,(FName *)((long)&uStack_28 + 4),false);
    if (pFVar1 == (FStateDefine *)0x0) break;
    this = (FStateDefinitions *)&pFVar1->Children;
    uVar3 = uVar3 + 1;
  }
  return (FState *)0x0;
}

Assistant:

FState *FStateDefinitions::FindState(const char * name)
{
	FStateDefine *statedef = NULL;

	TArray<FName> &namelist = MakeStateNameList(name);

	TArray<FStateDefine> *statelist = &StateLabels;
	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], false);
		if (statedef == NULL)
		{
			return NULL;
		}
		statelist = &statedef->Children;
	}
	return statedef ? statedef->State : NULL;
}